

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::PicturedInputBufferHash(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  undefined1 auVar1 [16];
  uint uVar2;
  uint uVar3;
  Cell CVar4;
  ulong uVar5;
  string local_50;
  
  requireDStackDepth(this,2,"#");
  this_00 = &this->dStack;
  uVar2 = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar3 = ForthStack<unsigned_int>::getTop(this_00,0);
  CVar4 = dataSpaceAtCell(this,this->VarOffsetNumericBase);
  if (CVar4 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"#: zero numeric base","");
    throwCppExceptionMessage(this,&local_50,errorUnsupportedOperation);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if (0x24 < CVar4) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"#: numeric base > 36","");
    throwCppExceptionMessage(this,&local_50,errorUnsupportedOperation);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  auVar1._8_8_ = 0;
  auVar1._0_8_ = CONCAT44(uVar3,uVar2);
  uVar5 = CONCAT44(uVar3,uVar2) % (ulong)CVar4;
  if (uVar5 < DAT_00158cb0) {
    local_50._M_dataplus._M_p._0_1_ = *(undefined1 *)(digitsCodes_abi_cxx11_ + uVar5);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (&this->picturedInputBuffer,(uchar *)&local_50);
    ForthStack<unsigned_int>::setTop(this_00,1,SUB164(auVar1 / ZEXT416(CVar4),0));
    ForthStack<unsigned_int>::setTop(this_00,0,SUB164(auVar1 / ZEXT416(CVar4),4));
    return;
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar5,
             DAT_00158cb0);
}

Assistant:

void PicturedInputBufferHash(){
			REQUIRE_DSTACK_DEPTH(2, "#");
			DCell d1(dStack.getTop(1),dStack.getTop(0));
			DCell base( getNumericBase() );
			RUNTIME_ERROR_IF(base.data_.Dcells == 0, "#: zero numeric base", errorUnsupportedOperation);
			RUNTIME_ERROR_IF(base.data_.Dcells > 36, "#: numeric base > 36", errorUnsupportedOperation);
			picturedInputBuffer.push_back(static_cast<Char>(digitsCodes.at(d1.data_.Dcells % base.data_.Dcells)));
			DCell d2( d1.data_.Dcells / base.data_.Dcells );
			dStack.setTop(1, d2.data_.Cells.lo);
			dStack.setTop(0, d2.data_.Cells.hi);
		}